

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

_Bool node_is_closure(gnode_t *node,uint16_t *param_2)

{
  gnode_function_decl_t *f;
  gnode_var_t *var;
  gnode_identifier_expr_t *identifier;
  uint16_t *local_index_local;
  gnode_t *node_local;
  
  if (param_2 != (uint16_t *)0x0) {
    *param_2 = 0;
  }
  local_index_local = (uint16_t *)node;
  if (((node != (gnode_t *)0x0) && (node != (gnode_t *)0x0)) && (node->tag == NODE_IDENTIFIER_EXPR))
  {
    local_index_local = *(uint16_t **)&node[1].token;
  }
  if (((local_index_local != (uint16_t *)0x0) && (local_index_local != (uint16_t *)0x0)) &&
     (*(int *)local_index_local == 0xc)) {
    if (param_2 != (uint16_t *)0x0) {
      *param_2 = local_index_local[0x36];
    }
    local_index_local = *(uint16_t **)(local_index_local + 0x30);
  }
  if (((local_index_local == (uint16_t *)0x0) || (local_index_local == (uint16_t *)0x0)) ||
     (*(int *)local_index_local != 8)) {
    node_local._7_1_ = false;
  }
  else {
    node_local._7_1_ = (_Bool)(*(byte *)((long)local_index_local + 0x7d) & 1);
  }
  return node_local._7_1_;
}

Assistant:

static bool node_is_closure (gnode_t *node, uint16_t *local_index) {
    DEBUG_CODEGEN("node_is_closure");
    
    // init local_index to 0 (means not a local index)
    if (local_index) *local_index = 0;
    
    if (node && NODE_ISA(node, NODE_IDENTIFIER_EXPR)) {
        gnode_identifier_expr_t *identifier = (gnode_identifier_expr_t *)node;
        node = identifier->symbol;
    }
    
    if (node && NODE_ISA(node, NODE_VARIABLE)) {
        gnode_var_t *var = (gnode_var_t *)node;
        if (local_index) *local_index = var->index;
        node = var->expr;
    }
    
    if (node && NODE_ISA(node, NODE_FUNCTION_DECL)) {
        gnode_function_decl_t *f = (gnode_function_decl_t *)node;
        return f->is_closure;
    }
    
    return false;
}